

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

float32 helper_recpe_f32_aarch64(float32 input,void *fpstp)

{
  _Bool _Var1;
  float32 fVar2;
  int iVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  int f32_exp;
  
  fVar2 = float32_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  f32_exp = fVar2 >> 0x17 & 0xff;
  uVar5 = fVar2 & 0x7fffffff;
  if (uVar5 < 0x7f800001) {
    uVar6 = fVar2 & 0x80000000;
    if (uVar5 != 0x7f800000) {
      if (uVar5 == 0) {
        float_raise_aarch64('\x04',(float_status *)fpstp);
        uVar6 = fVar2 | 0x7f800000;
      }
      else if (uVar5 < 0x200000) {
        float_raise_aarch64('(',(float_status *)fpstp);
        _Var1 = round_to_inf((float_status *)fpstp,SUB41(fVar2 >> 0x1f,0));
        if (_Var1) {
          uVar6 = uVar6 | 0x7f800000;
        }
        else {
          uVar6 = uVar6 | 0x7f7fffff;
        }
      }
      else if (((uint)f32_exp < 0xfd) || (*(char *)((long)fpstp + 4) == '\0')) {
        uVar4 = call_recip_estimate(&f32_exp,0xfd,(ulong)(fVar2 & 0x7fffff) << 0x1d);
        uVar6 = (uint)(uVar4 >> 0x1d) & 0x7fffff | (f32_exp & 0xffU) << 0x17 | uVar6;
      }
      else {
        float_raise_aarch64('\x10',(float_status *)fpstp);
      }
    }
  }
  else {
    iVar3 = float32_is_signaling_nan_aarch64(fVar2,(float_status *)fpstp);
    if (iVar3 != 0) {
      float_raise_aarch64('\x01',(float_status *)fpstp);
      fVar2 = float32_silence_nan_aarch64(fVar2,(float_status *)fpstp);
    }
    uVar6 = fVar2;
    if (*(char *)((long)fpstp + 6) != '\0') {
      fVar2 = float32_default_nan_aarch64((float_status *)fpstp);
      return fVar2;
    }
  }
  return uVar6;
}

Assistant:

float32 HELPER(recpe_f32)(float32 input, void *fpstp)
{
    float_status *fpst = fpstp;
    float32 f32 = float32_squash_input_denormal(input, fpst);
    uint32_t f32_val = float32_val(f32);
    bool f32_sign = float32_is_neg(f32);
    int f32_exp = extract32(f32_val, 23, 8);
    uint32_t f32_frac = extract32(f32_val, 0, 23);
    uint64_t f64_frac;

    if (float32_is_any_nan(f32)) {
        float32 nan = f32;
        if (float32_is_signaling_nan(f32, fpst)) {
            float_raise(float_flag_invalid, fpst);
            nan = float32_silence_nan(f32, fpst);
        }
        if (fpst->default_nan_mode) {
            nan =  float32_default_nan(fpst);
        }
        return nan;
    } else if (float32_is_infinity(f32)) {
        return float32_set_sign(float32_zero, float32_is_neg(f32));
    } else if (float32_is_zero(f32)) {
        float_raise(float_flag_divbyzero, fpst);
        return float32_set_sign(float32_infinity, float32_is_neg(f32));
    } else if (float32_abs(f32) < (1ULL << 21)) {
        /* Abs(value) < 2.0^-128 */
        float_raise(float_flag_overflow | float_flag_inexact, fpst);
        if (round_to_inf(fpst, f32_sign)) {
            return float32_set_sign(float32_infinity, f32_sign);
        } else {
            return float32_set_sign(float32_maxnorm, f32_sign);
        }
    } else if (f32_exp >= 253 && fpst->flush_to_zero) {
        float_raise(float_flag_underflow, fpst);
        return float32_set_sign(float32_zero, float32_is_neg(f32));
    }

    f64_frac = call_recip_estimate(&f32_exp, 253,
                                   ((uint64_t) f32_frac) << (52 - 23));

    /* result = sign : result_exp<7:0> : fraction<51:29> */
    f32_val = deposit32(0, 31, 1, f32_sign);
    f32_val = deposit32(f32_val, 23, 8, f32_exp);
    f32_val = deposit32(f32_val, 0, 23, extract64(f64_frac, 52 - 23, 23));
    return make_float32(f32_val);
}